

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.c
# Opt level: O0

ZyanBool ZydisIsBroadcastModeCompatible
                   (ZydisInstructionDefinitionEVEX *evex_def,ZydisVectorLength vector_length,
                   ZydisBroadcastMode broadcast)

{
  byte bVar1;
  ZydisBroadcastMode local_28;
  byte local_22;
  ZyanU8 element_count;
  ZydisBroadcastMode allowed_mode;
  ZyanU8 element_size;
  ZyanU8 vector_size;
  ZydisBroadcastMode broadcast_local;
  ZydisVectorLength vector_length_local;
  ZydisInstructionDefinitionEVEX *evex_def_local;
  
  if (broadcast == ZYDIS_BROADCAST_MODE_INVALID) {
    evex_def_local._7_1_ = '\x01';
  }
  else {
    if (vector_length == ZYDIS_VECTOR_LENGTH_INVALID) {
      __assert_fail("vector_length != ZYDIS_VECTOR_LENGTH_INVALID",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                    ,0x88f,
                    "ZyanBool ZydisIsBroadcastModeCompatible(const ZydisInstructionDefinitionEVEX *, ZydisVectorLength, ZydisBroadcastMode)"
                   );
    }
    if (vector_length == ZYDIS_VECTOR_LENGTH_128) {
      element_count = '\x10';
    }
    else if (vector_length == ZYDIS_VECTOR_LENGTH_256) {
      element_count = ' ';
    }
    else {
      if (vector_length != ZYDIS_VECTOR_LENGTH_512) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0x89c,
                      "ZyanBool ZydisIsBroadcastModeCompatible(const ZydisInstructionDefinitionEVEX *, ZydisVectorLength, ZydisBroadcastMode)"
                     );
      }
      element_count = '@';
    }
    bVar1 = evex_def->field_0xd & 0x1f;
    if (bVar1 != 1) {
      if (bVar1 == 2) {
        element_count = element_count / 2;
      }
      else {
        if (bVar1 != 0x10) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0x8a9,
                        "ZyanBool ZydisIsBroadcastModeCompatible(const ZydisInstructionDefinitionEVEX *, ZydisVectorLength, ZydisBroadcastMode)"
                       );
        }
        element_count = element_count / 4;
      }
    }
    bVar1 = (byte)evex_def->field_0xd >> 5;
    if (bVar1 == 2) {
      local_22 = 2;
    }
    else if (bVar1 == 3) {
      local_22 = 4;
    }
    else {
      if (bVar1 != 4) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0x8b9,
                      "ZyanBool ZydisIsBroadcastModeCompatible(const ZydisInstructionDefinitionEVEX *, ZydisVectorLength, ZydisBroadcastMode)"
                     );
      }
      local_22 = 8;
    }
    switch(element_count / local_22) {
    case 2:
      local_28 = ZYDIS_BROADCAST_MODE_1_TO_2;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                    ,0x8d0,
                    "ZyanBool ZydisIsBroadcastModeCompatible(const ZydisInstructionDefinitionEVEX *, ZydisVectorLength, ZydisBroadcastMode)"
                   );
    case 4:
      local_28 = ZYDIS_BROADCAST_MODE_1_TO_4;
      break;
    case 8:
      local_28 = ZYDIS_BROADCAST_MODE_1_TO_8;
      break;
    case 0x10:
      local_28 = ZYDIS_BROADCAST_MODE_1_TO_16;
      break;
    case 0x20:
      local_28 = ZYDIS_BROADCAST_MODE_1_TO_32;
    }
    if (broadcast == local_28) {
      evex_def_local._7_1_ = '\x01';
    }
    else {
      evex_def_local._7_1_ = '\0';
    }
  }
  return evex_def_local._7_1_;
}

Assistant:

static ZyanBool ZydisIsBroadcastModeCompatible(const ZydisInstructionDefinitionEVEX *evex_def,
    ZydisVectorLength vector_length, ZydisBroadcastMode broadcast)
{
    if (broadcast == ZYDIS_BROADCAST_MODE_INVALID)
    {
        return ZYAN_TRUE;
    }

    ZyanU8 vector_size = 0;
    ZYAN_ASSERT(vector_length != ZYDIS_VECTOR_LENGTH_INVALID);
    switch (vector_length)
    {
    case ZYDIS_VECTOR_LENGTH_128:
        vector_size = 16;
        break;
    case ZYDIS_VECTOR_LENGTH_256:
        vector_size = 32;
        break;
    case ZYDIS_VECTOR_LENGTH_512:
        vector_size = 64;
        break;
    default:
        ZYAN_UNREACHABLE;
    }
    switch (evex_def->tuple_type)
    {
    case ZYDIS_TUPLETYPE_FV:
        break;
    case ZYDIS_TUPLETYPE_HV:
        vector_size /= 2;
        break;
    case ZYDIS_TUPLETYPE_QUARTER:
        vector_size /= 4;
        break;
    default:
        ZYAN_UNREACHABLE;
    }

    ZyanU8 element_size;
    switch (evex_def->element_size)
    {
    case ZYDIS_IELEMENT_SIZE_16:
        element_size = 2;
        break;
    case ZYDIS_IELEMENT_SIZE_32:
        element_size = 4;
        break;
    case ZYDIS_IELEMENT_SIZE_64:
        element_size = 8;
        break;
    default:
        ZYAN_UNREACHABLE;
    }

    ZydisBroadcastMode allowed_mode;
    const ZyanU8 element_count = vector_size / element_size;
    switch (element_count)
    {
    case 2:
        allowed_mode = ZYDIS_BROADCAST_MODE_1_TO_2;
        break;
    case 4:
        allowed_mode = ZYDIS_BROADCAST_MODE_1_TO_4;
        break;
    case 8:
        allowed_mode = ZYDIS_BROADCAST_MODE_1_TO_8;
        break;
    case 16:
        allowed_mode = ZYDIS_BROADCAST_MODE_1_TO_16;
        break;
    case 32:
        allowed_mode = ZYDIS_BROADCAST_MODE_1_TO_32;
        break;
    default:
        ZYAN_UNREACHABLE;
    }

    if (broadcast != allowed_mode)
    {
        return ZYAN_FALSE;
    }

    return ZYAN_TRUE;
}